

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_encoder.c
# Opt level: O2

int pt_encode_ip(pt_encoder *encoder,pt_opcode op,pt_packet_ip *packet)

{
  pt_ip_compression pVar1;
  uint size;
  byte *pbVar2;
  uint uVar3;
  uint8_t *puVar4;
  uint size_00;
  
  if (packet == (pt_packet_ip *)0x0) {
    uVar3 = 1;
  }
  else {
    pVar1 = packet->ipc;
    uVar3 = 0xfffffffe;
    if (((ulong)pVar1 < 7) && ((0x5fU >> (pVar1 & 0x1f) & 1) != 0)) {
      size = *(uint *)(&DAT_0011263c + (ulong)pVar1 * 4);
      size_00 = size | 1;
      uVar3 = pt_reserve(encoder,size_00);
      if (-1 < (int)uVar3) {
        pbVar2 = encoder->pos;
        *pbVar2 = (byte)(pVar1 << 5) | (byte)op;
        puVar4 = pt_encode_int(pbVar2 + 1,packet->ip,size);
        encoder->pos = puVar4;
        uVar3 = size_00;
      }
    }
  }
  return uVar3;
}

Assistant:

static int pt_encode_ip(struct pt_encoder *encoder, enum pt_opcode op,
			const struct pt_packet_ip *packet)
{
	uint8_t *pos;
	uint8_t opc, ipc;
	int size, errcode;

	if (!encoder || !packet)
		return pte_internal;

	size = pt_ipc_size(packet->ipc);
	if (size < 0)
		return size;

	errcode = pt_reserve(encoder,
			     /* opc size = */ 1u + (unsigned int) size);
	if (errcode < 0)
		return errcode;

	/* We already checked the ipc in pt_ipc_size(). */
	ipc = (uint8_t) (packet->ipc << pt_opm_ipc_shr);
	opc = (uint8_t) op;

	pos = encoder->pos;
	*pos++ = opc | ipc;

	encoder->pos = pt_encode_int(pos, packet->ip, size);
	return /* opc size = */ 1 + size;
}